

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  ChunkHeader *pCVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  ulong capacity;
  
  if (size == 0) {
    return (void *)0x0;
  }
  uVar4 = size + 7 & 0xfffffffffffffff8;
  pCVar1 = this->shared_->chunkHead;
  if (pCVar1->capacity < pCVar1->size + uVar4) {
    capacity = this->chunk_capacity_;
    if (this->chunk_capacity_ <= uVar4) {
      capacity = uVar4;
    }
    bVar3 = AddChunk(this,capacity);
    if (!bVar3) {
      return (void *)0x0;
    }
  }
  pCVar1 = this->shared_->chunkHead;
  sVar2 = pCVar1->size;
  pCVar1->size = uVar4 + sVar2;
  return (void *)((long)&pCVar1[1].capacity + sVar2);
}

Assistant:

void* Malloc(size_t size) {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (RAPIDJSON_UNLIKELY(shared_->chunkHead->size + size > shared_->chunkHead->capacity))
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = GetChunkBuffer(shared_) + shared_->chunkHead->size;
        shared_->chunkHead->size += size;
        return buffer;
    }